

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O1

void __thiscall CVmHandleManager::delete_obj(CVmHandleManager *this)

{
  ulong uVar1;
  
  if (this->handles_max_ != 0) {
    uVar1 = 0;
    do {
      if (this->handles_[uVar1] != (void *)0x0) {
        (*this->_vptr_CVmHandleManager[2])(this,(ulong)((int)uVar1 + 1));
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->handles_max_);
  }
  (*this->_vptr_CVmHandleManager[1])(this);
  return;
}

Assistant:

void CVmHandleManager::delete_obj(VMG0_)
{
    size_t i;

    /* 
     *   Delete each remaining object.  Note that we need to call the virtual
     *   delete_handle_object routine, so we must do this before reaching the
     *   destructor (once in the base class destructor, we no longer have
     *   access to the subclass virtuals).  
     */
    for (i = 0 ; i < handles_max_ ; ++i)
    {
        /* if this banner is still valid, delete it */
        if (handles_[i] != 0)
            delete_handle_object(vmg_ i + 1, handles_[i]);
    }

    /* delete the object */
    delete this;
}